

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::OP_InvalidWasmTypeConversion<5,true>(InterpreterStackFrame *this,...)

{
  char16 *pcVar1;
  
  pcVar1 = Wasm::WasmTypes::GetTypeName(V128);
  JavascriptError::ThrowTypeErrorVar
            (*(ScriptContext **)(this + 0x78),-0x7ff5e49f,pcVar1,L"Javascript Variable");
}

Assistant:

void InterpreterStackFrame::OP_InvalidWasmTypeConversion(...)
    {
#ifdef ENABLE_WASM
        CompileAssert(type < Wasm::WasmTypes::Limit);
        const char16* fromType = toJs ? Wasm::WasmTypes::GetTypeName(static_cast<Wasm::WasmTypes::WasmType>(type)) : _u("Javascript Variable");
        const char16* toType = toJs ? _u("Javascript Variable") : Wasm::WasmTypes::GetTypeName(static_cast<Wasm::WasmTypes::WasmType>(type));
        JavascriptError::ThrowTypeErrorVar(scriptContext, WASMERR_InvalidTypeConversion, fromType, toType);
#else
        Assert(UNREACHED); //shouldn't get there
        JavascriptError::ThrowTypeErrorVar(scriptContext, WASMERR_InvalidTypeConversion, _u("unknown"), _u("unknown")); //throw for a release build
#endif
    }